

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void jmp_append(FuncState *fs,BCPos *l1,BCPos l2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (l2 != 0xffffffff) {
    if (*l1 == 0xffffffff) {
      *l1 = l2;
    }
    else {
      uVar2 = *l1;
      do {
        uVar1 = uVar2;
        lVar3 = (ulong)*(ushort *)((long)&fs->bcbase[uVar1].ins + 2) - 0x8000;
        uVar2 = uVar1 + 1 + (int)lVar3;
        if (lVar3 == -1) {
          uVar2 = 0xffffffff;
        }
      } while (uVar2 != 0xffffffff);
      uVar2 = (l2 - uVar1) + 0x7fff;
      if (0xffff < uVar2) {
        err_syntax(fs->ls,LJ_ERR_XJUMP);
      }
      *(short *)((long)&fs->bcbase[uVar1].ins + 2) = (short)uVar2;
    }
  }
  return;
}

Assistant:

static void jmp_append(FuncState *fs, BCPos *l1, BCPos l2)
{
  if (l2 == NO_JMP) {
    return;
  } else if (*l1 == NO_JMP) {
    *l1 = l2;
  } else {
    BCPos list = *l1;
    BCPos next;
    while ((next = jmp_next(fs, list)) != NO_JMP)  /* Find last element. */
      list = next;
    jmp_patchins(fs, list, l2);
  }
}